

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_dense.c
# Opt level: O2

void __thiscall lu_solve_dense(void *this,double *rhs,double *lhs,char trans)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  void *__dest;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  double dVar27;
  byte local_c4;
  
  uVar1 = *(uint *)((long)this + 0x54);
  uVar26 = (ulong)uVar1;
  uVar2 = *(uint *)((long)this + 0x68);
  lVar21 = *(long *)((long)this + 0x250);
  lVar17 = *(long *)((long)this + 0x200);
  lVar20 = *(long *)((long)this + 0x1d8);
  lVar4 = *(long *)((long)this + 0x1e8);
  lVar22 = *(long *)((long)this + 0x278);
  lVar24 = *(long *)((long)this + 0x240);
  lVar25 = *(long *)((long)this + 0x280);
  piVar5 = *(int **)((long)this + 0x1f8);
  lVar6 = *(long *)((long)this + 0x218);
  lVar7 = *(long *)((long)this + 0x228);
  lVar8 = *(long *)((long)this + 0x2a8);
  lVar9 = *(long *)((long)this + 0x2b0);
  lVar10 = *(long *)((long)this + 0x1a0);
  lVar11 = *(long *)((long)this + 0x1b8);
  lVar12 = *(long *)((long)this + 0x1a8);
  lVar13 = *(long *)((long)this + 0x1c0);
  lVar14 = *(long *)((long)this + 0x1b0);
  lVar15 = *(long *)((long)this + 0x1c8);
  __dest = *(void **)((long)this + 0x2a0);
  lu_garbage_perm(this);
  local_c4 = trans & 0xdf;
  memcpy(__dest,rhs,(long)(int)uVar1 << 3);
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  if (local_c4 == 0x54) {
    for (uVar19 = 0; uVar23 = (ulong)uVar2, uVar19 != uVar16; uVar19 = uVar19 + 1) {
      lVar24 = (long)*(int *)(lVar20 + uVar19 * 4);
      iVar18 = *(int *)(lVar4 + uVar19 * 4);
      dVar27 = *(double *)((long)__dest + lVar24 * 8) / *(double *)(lVar8 + lVar24 * 8);
      iVar3 = *(int *)(lVar7 + lVar24 * 4);
      for (lVar24 = (long)*(int *)(lVar6 + lVar24 * 4); lVar24 < iVar3; lVar24 = lVar24 + 1) {
        lVar25 = (long)*(int *)(lVar14 + lVar24 * 4);
        *(double *)((long)__dest + lVar25 * 8) =
             *(double *)(lVar15 + lVar24 * 8) * -dVar27 + *(double *)((long)__dest + lVar25 * 8);
      }
      lhs[iVar18] = dVar27;
    }
    while (0 < (int)uVar23) {
      uVar16 = uVar23 - 1;
      iVar18 = piVar5[uVar23];
      dVar27 = lhs[*(int *)(lVar17 + uVar16 * 4)];
      for (lVar20 = (long)piVar5[uVar16]; uVar23 = uVar16, lVar20 < iVar18; lVar20 = lVar20 + 1) {
        iVar3 = *(int *)(lVar10 + lVar20 * 4);
        lhs[iVar3] = *(double *)(lVar11 + lVar20 * 8) * -dVar27 + lhs[iVar3];
      }
    }
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      dVar27 = 0.0;
      for (lVar17 = (long)*(int *)(lVar22 + uVar26 * 4) << 2; -1 < (long)*(int *)(lVar10 + lVar17);
          lVar17 = lVar17 + 4) {
        dVar27 = dVar27 + lhs[*(int *)(lVar10 + lVar17)] * *(double *)(lVar11 + lVar17 * 2);
      }
      iVar18 = *(int *)(lVar21 + uVar26 * 4);
      lhs[iVar18] = lhs[iVar18] - dVar27;
    }
  }
  else {
    for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
      dVar27 = 0.0;
      for (lVar22 = (long)*(int *)(lVar24 + uVar19 * 4) << 2; -1 < (long)*(int *)(lVar10 + lVar22);
          lVar22 = lVar22 + 4) {
        dVar27 = dVar27 + *(double *)((long)__dest + (long)*(int *)(lVar10 + lVar22) * 8) *
                          *(double *)(lVar11 + lVar22 * 2);
      }
      lVar22 = (long)*(int *)(lVar21 + uVar19 * 4);
      *(double *)((long)__dest + lVar22 * 8) = *(double *)((long)__dest + lVar22 * 8) - dVar27;
    }
    iVar18 = *piVar5;
    uVar19 = 0;
    uVar16 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar16 = uVar19;
    }
    while (uVar19 != uVar16) {
      lVar22 = (long)*(int *)(lVar17 + uVar19 * 4);
      lVar24 = (long)iVar18;
      lVar21 = uVar19 + 1;
      uVar19 = uVar19 + 1;
      iVar3 = piVar5[lVar21];
      if (piVar5[lVar21] < iVar18) {
        iVar3 = iVar18;
      }
      iVar18 = iVar3;
      dVar27 = 0.0;
      for (; iVar18 != lVar24; lVar24 = lVar24 + 1) {
        dVar27 = dVar27 + *(double *)((long)__dest + (long)*(int *)(lVar10 + lVar24 * 4) * 8) *
                          *(double *)(lVar11 + lVar24 * 8);
      }
      *(double *)((long)__dest + lVar22 * 8) = *(double *)((long)__dest + lVar22 * 8) - dVar27;
    }
    while (0 < (int)uVar26) {
      uVar26 = uVar26 - 1;
      iVar18 = *(int *)(lVar20 + uVar26 * 4);
      lVar21 = (long)*(int *)(lVar4 + uVar26 * 4);
      dVar27 = *(double *)((long)__dest + lVar21 * 8) / *(double *)(lVar9 + lVar21 * 8);
      for (lVar21 = (long)*(int *)(lVar25 + lVar21 * 4) << 2;
          lVar17 = (long)*(int *)(lVar12 + lVar21), -1 < lVar17; lVar21 = lVar21 + 4) {
        *(double *)((long)__dest + lVar17 * 8) =
             *(double *)(lVar13 + lVar21 * 2) * -dVar27 + *(double *)((long)__dest + lVar17 * 8);
      }
      lhs[iVar18] = dVar27;
    }
  }
  return;
}

Assistant:

void lu_solve_dense(struct lu *this, const double *rhs, double *lhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int *p                 = this->p;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    double *work1                   = this->work1;

    lu_int i, k, t, ipivot, jpivot, pos;
    double x;

    lu_garbage_perm(this);
    assert(this->pivotlen == m);

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with U'. */
        for (k = 0; k < m; k++)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[jpivot] / col_pivot[jpivot];
            for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
            {
                work1[Windex[pos]] -= x * Wvalue[pos];
            }
            lhs[ipivot] = x;
        }

        /* Solve with update ETAs backwards. */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            x = lhs[ipivot];
            for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
            {
                i = Lindex[pos];
                lhs[i] -= x * Lvalue[pos];
            }
        }

        /* Solve with L'. */
        for (k = m-1; k >= 0; k--)
        {
            x = 0.0;
            for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += lhs[i] * Lvalue[pos];
            }
            lhs[p[k]] -= x;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with L. */
        for (k = 0; k < m; k++)
        {
            x = 0.0;
            for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += work1[i] * Lvalue[pos];
            }
            work1[p[k]] -= x;
        }

        /* Solve with update ETAs. */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work1[Lindex[pos]] * Lvalue[pos];
            }
            work1[ipivot] -= x;
        }

        /* Solve with U. */
        for (k = m-1; k >= 0; k--)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[ipivot] / row_pivot[ipivot];
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                work1[i] -= x * Uvalue[pos];
            }
            lhs[jpivot] = x;
        }
    }
}